

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall TempDir::TempDir(TempDir *this,path *pt)

{
  this->_vptr_TempDir = (_func_int **)&PTR__TempDir_00117908;
  std::__cxx11::string::string((string *)&this->p,(string *)pt);
  boost::filesystem::create_directory(&this->p);
  return;
}

Assistant:

TempDir(path pt) : p(pt) {
    create_directory(p);
  }